

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt,int ch1,int ch2,xmlXPathOp op,int value,
                       int value2,int value3,void *value4,void *value5)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  uint uVar6;
  
  pxVar2 = ctxt->comp;
  iVar1 = pxVar2->maxStep;
  if (iVar1 <= pxVar2->nbStep) {
    if (iVar1 < 1) {
      uVar6 = 10;
    }
    else {
      uVar6 = 0xffffffff;
      if (iVar1 < 1000000) {
        uVar5 = iVar1 + 1U >> 1;
        uVar6 = uVar5 + iVar1;
        if ((int)(1000000 - uVar5) < iVar1) {
          uVar6 = 1000000;
        }
      }
    }
    if (((int)uVar6 < 0) ||
       (pxVar3 = (xmlXPathStepOp *)(*xmlRealloc)(pxVar2->steps,(ulong)uVar6 * 0x38),
       pxVar3 == (xmlXPathStepOp *)0x0)) {
      xmlXPathPErrMemory(ctxt);
      return -1;
    }
    pxVar2->steps = pxVar3;
    pxVar2->maxStep = uVar6;
  }
  iVar1 = pxVar2->nbStep;
  pxVar2->last = iVar1;
  pxVar3 = pxVar2->steps;
  pxVar3[iVar1].ch1 = ch1;
  pxVar3[iVar1].ch2 = ch2;
  pxVar3[iVar1].op = op;
  pxVar3[iVar1].value = value;
  pxVar3[iVar1].value2 = value2;
  pxVar3[iVar1].value3 = value3;
  if (((pxVar2->dict == (xmlDictPtr)0x0) || (XPATH_OP_FUNCTION < op)) ||
     ((0x3400U >> (op & (XPATH_OP_FILTER|XPATH_OP_PREDICATE)) & 1) == 0)) {
    pxVar3[iVar1].value4 = value4;
    pxVar3[iVar1].value5 = value5;
  }
  else {
    if (value4 == (void *)0x0) {
      pxVar3[iVar1].value4 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar2->dict,(xmlChar *)value4,-1);
      pxVar2->steps[pxVar2->nbStep].value4 = pxVar4;
      (*xmlFree)(value4);
    }
    if (value5 == (void *)0x0) {
      pxVar2->steps[pxVar2->nbStep].value5 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar2->dict,(xmlChar *)value5,-1);
      pxVar2->steps[pxVar2->nbStep].value5 = pxVar4;
      (*xmlFree)(value5);
    }
  }
  iVar1 = pxVar2->nbStep;
  pxVar2->steps[iVar1].cache = (xmlXPathFunction)0x0;
  pxVar2->nbStep = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt, int ch1, int ch2,
   xmlXPathOp op, int value,
   int value2, int value3, void *value4, void *value5) {
    xmlXPathCompExprPtr comp = ctxt->comp;
    if (comp->nbStep >= comp->maxStep) {
	xmlXPathStepOp *real;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(real[0]),
                                  10, XPATH_MAX_STEPS);
        if (newSize < 0) {
	    xmlXPathPErrMemory(ctxt);
	    return(-1);
        }
	real = xmlRealloc(comp->steps, newSize * sizeof(real[0]));
	if (real == NULL) {
	    xmlXPathPErrMemory(ctxt);
	    return(-1);
	}
	comp->steps = real;
	comp->maxStep = newSize;
    }
    comp->last = comp->nbStep;
    comp->steps[comp->nbStep].ch1 = ch1;
    comp->steps[comp->nbStep].ch2 = ch2;
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->steps[comp->nbStep].value3 = value3;
    if ((comp->dict != NULL) &&
        ((op == XPATH_OP_FUNCTION) || (op == XPATH_OP_VARIABLE) ||
	 (op == XPATH_OP_COLLECT))) {
        if (value4 != NULL) {
	    comp->steps[comp->nbStep].value4 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value4, -1);
	    xmlFree(value4);
	} else
	    comp->steps[comp->nbStep].value4 = NULL;
        if (value5 != NULL) {
	    comp->steps[comp->nbStep].value5 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value5, -1);
	    xmlFree(value5);
	} else
	    comp->steps[comp->nbStep].value5 = NULL;
    } else {
	comp->steps[comp->nbStep].value4 = value4;
	comp->steps[comp->nbStep].value5 = value5;
    }
    comp->steps[comp->nbStep].cache = NULL;
    return(comp->nbStep++);
}